

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O2

void __thiscall QColor::setRgb(QColor *this,QRgb rgb)

{
  this->cspec = Rgb;
  (this->ct).argb.alpha = 0xffff;
  (this->ct).argb.red = (short)((rgb & 0xff00ff) >> 0x10) * 0x101;
  *(uint *)((long)&this->ct + 4) =
       CONCAT22((short)(rgb & 0xff00ff) * 0x101,((ushort)(rgb >> 8) & 0xff) * 0x101);
  (this->ct).argb.pad = 0;
  return;
}

Assistant:

void QColor::setRgb(QRgb rgb) noexcept
{
    cspec = Rgb;
    ct.argb.alpha = 0xffff;
    ct.argb.red   = qRed(rgb)   * 0x101;
    ct.argb.green = qGreen(rgb) * 0x101;
    ct.argb.blue  = qBlue(rgb)  * 0x101;
    ct.argb.pad   = 0;
}